

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reply_deferrable.c
# Opt level: O0

mpt_metatype *
mpt_reply_deferrable
          (size_t len,_func_int_void_ptr_mpt_reply_data_ptr_mpt_message_ptr *send,void *ptr)

{
  undefined8 *puVar1;
  long local_40;
  size_t post;
  mpt_reply_context_defer *ctx;
  void *ptr_local;
  _func_int_void_ptr_mpt_reply_data_ptr_mpt_message_ptr *send_local;
  size_t len_local;
  
  if (len < 0x10000) {
    if (len < 5) {
      local_40 = 0;
    }
    else {
      local_40 = len - 4;
    }
    puVar1 = (undefined8 *)malloc(local_40 + 0x30);
    if (puVar1 == (undefined8 *)0x0) {
      len_local = 0;
    }
    else {
      *puVar1 = send;
      puVar1[1] = ptr;
      puVar1[2] = 1;
      puVar1[3] = &mpt_reply_deferrable::replyMeta;
      puVar1[4] = &mpt_reply_deferrable::replyCtx;
      *(short *)(puVar1 + 5) = (short)len;
      *(undefined2 *)((long)puVar1 + 0x2a) = 0;
      len_local = (size_t)(puVar1 + 3);
    }
  }
  else {
    len_local = 0;
  }
  return (mpt_metatype *)len_local;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_reply_deferrable(size_t len, int (*send)(void *, const MPT_STRUCT(reply_data) *, const MPT_STRUCT(message) *), void *ptr)
{
	static const MPT_INTERFACE_VPTR(metatype) replyMeta = {
		{ contextConv },
		contextUnref,
		contextRef,
		contextClone
	};
	static const MPT_INTERFACE_VPTR(reply_context) replyCtx = {
		contextSet,
		contextDefer
	};
	MPT_STRUCT(reply_context_defer) *ctx;
	size_t post;
	
	if (len > UINT16_MAX) {
		return 0;
	}
	post = len > sizeof(ctx->data.val) ? len - sizeof(ctx->data.val) : 0;
	if (!(ctx = malloc(sizeof(*ctx) + post))) {
		return 0;
	}
	ctx->reply.send = send;
	ctx->reply.ptr  = ptr;
	
	ctx->ref._val = 1;
	
	ctx->_mt._vptr = &replyMeta;
	ctx->_ctx._vptr = &replyCtx;
	
	ctx->data._max = len;
	ctx->data.len = 0;
	
	return &ctx->_mt;
}